

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsValidation.cpp
# Opt level: O1

size_t chrono::utils::ChValidation::ReadDataFile
                 (string *filename,char delim,Headers *headers,Data *data)

{
  long lVar1;
  pointer pbVar2;
  pointer pbVar3;
  pointer pvVar4;
  char cVar5;
  istream *piVar6;
  void *pvVar7;
  long lVar8;
  size_type __new_size;
  long lVar9;
  long lVar10;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  string line;
  string col_header;
  ifstream ifile;
  stringstream iss1;
  stringstream iss;
  size_t local_5b0;
  undefined1 *local_5a0;
  undefined8 local_598;
  undefined1 local_590;
  undefined7 uStack_58f;
  difference_type local_580;
  value_type local_578;
  pointer local_558;
  pointer local_550;
  long local_548 [29];
  undefined8 auStack_460 [36];
  stringstream local_340 [128];
  ios_base local_2c0 [264];
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  std::ifstream::ifstream(local_548,(filename->_M_dataplus)._M_p,_S_in);
  local_5a0 = &local_590;
  local_598 = 0;
  local_590 = 0;
  local_340[0] = (stringstream)0xa;
  __first._8_8_ = 0xffffffff;
  __first._M_sbuf = *(streambuf_type **)((long)auStack_460 + *(long *)(local_548[0] + -0x18));
  local_580 = std::
              __count_if<std::istreambuf_iterator<char,std::char_traits<char>>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                        (__first,(istreambuf_iterator<char,_std::char_traits<char>_>)
                                 (ZEXT816(0xffffffff) << 0x40),
                         (_Iter_equals_val<const_char>)local_340);
  std::istream::seekg((long)local_548,_S_beg);
  cVar5 = std::ios::widen((char)local_548 + (char)*(undefined8 *)(local_548[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_548,(string *)&local_5a0,cVar5);
  cVar5 = std::ios::widen((char)(istream *)local_548 + (char)*(undefined8 *)(local_548[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_548,(string *)&local_5a0,cVar5);
  cVar5 = std::ios::widen((char)(istream *)local_548 + (char)*(undefined8 *)(local_548[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_548,(string *)&local_5a0,cVar5);
  std::__cxx11::stringstream::stringstream(local_340,(string *)&local_5a0,_S_out|_S_in);
  local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_578,"");
  lVar8 = local_580 + -3;
  while (piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)local_340,(string *)&local_578,delim),
        ((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(headers,&local_578);
  }
  pbVar2 = (headers->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (headers->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  __new_size = (long)pbVar3 - (long)pbVar2 >> 5;
  std::vector<std::valarray<double>,_std::allocator<std::valarray<double>_>_>::resize
            (data,__new_size);
  local_558 = pbVar2;
  local_550 = pbVar3;
  if (pbVar3 != pbVar2) {
    lVar1 = local_580 * 8;
    lVar10 = __new_size + (__new_size == 0);
    lVar9 = 8;
    do {
      pvVar4 = (data->
               super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if (*(long *)((long)pvVar4 + lVar9 + -8) != lVar8) {
        operator_delete(*(void **)((long)&pvVar4->_M_size + lVar9));
        *(long *)((long)pvVar4 + lVar9 + -8) = lVar8;
        pvVar7 = ::operator_new(lVar8 * 8);
        *(void **)((long)&pvVar4->_M_size + lVar9) = pvVar7;
      }
      if (lVar8 != 0) {
        memset(*(void **)((long)&pvVar4->_M_size + lVar9),0,lVar1 - 0x18);
      }
      lVar9 = lVar9 + 0x10;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
  }
  local_5b0 = 0;
  while( true ) {
    cVar5 = std::ios::widen((char)*(undefined8 *)(local_548[0] + -0x18) + (char)(istream *)local_548
                           );
    piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_548,(string *)&local_5a0,cVar5);
    pbVar2 = local_550;
    if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::stringstream::stringstream(local_1b8,(string *)&local_5a0,_S_out|_S_in);
    lVar8 = __new_size + (__new_size == 0);
    if (pbVar2 != local_558) {
      do {
        std::istream::_M_extract<double>((double *)local_1b8);
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
    local_5b0 = local_5b0 + 1;
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578._M_dataplus._M_p != &local_578.field_2) {
    operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_340);
  std::ios_base::~ios_base(local_2c0);
  if (local_5a0 != &local_590) {
    operator_delete(local_5a0,CONCAT71(uStack_58f,local_590) + 1);
  }
  std::ifstream::~ifstream(local_548);
  return local_5b0;
}

Assistant:

size_t ChValidation::ReadDataFile(const std::string& filename,
                                  char               delim,
                                  Headers&           headers,
                                  Data&              data)
{
  std::ifstream ifile(filename.c_str());
  std::string   line;

  // Count the number of lines in the file then rewind the input file stream.
  size_t num_lines = std::count(std::istreambuf_iterator<char>(ifile),
                                std::istreambuf_iterator<char>(), '\n');
  ifile.seekg(0, ifile.beg);

  size_t num_data_points = num_lines - 3;

  // Skip the first two lines.
  std::getline(ifile, line);
  std::getline(ifile, line);

  // Read the line with column headers.
  std::getline(ifile, line);
  std::stringstream iss1(line);
  std::string col_header = "";

  while (std::getline(iss1, col_header, delim))
    headers.push_back(col_header);

  size_t num_cols = headers.size();

  // Resize data
  data.resize(num_cols);
  for (size_t col = 0; col < num_cols; col++)
    data[col].resize(num_data_points);

  // Read the actual data, one line at a time.
  size_t row = 0;
  while (std::getline(ifile, line)) {
    std::stringstream iss(line);
    for (size_t col = 0; col < num_cols; col++)
      iss >> data[col][row];
    row++;
  }

  return row;
}